

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertions(JunitReporter *this,SectionNode *sectionNode)

{
  bool bVar1;
  reference this_00;
  AssertionStats *stats;
  AssertionOrBenchmarkResult *assertionOrBenchmark;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
  *__range1;
  SectionNode *sectionNode_local;
  JunitReporter *this_local;
  
  __end1 = std::
           vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
           ::begin(&sectionNode->assertionsAndBenchmarks);
  assertionOrBenchmark =
       (AssertionOrBenchmarkResult *)
       std::
       vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
       ::end(&sectionNode->assertionsAndBenchmarks);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Catch::Detail::AssertionOrBenchmarkResult_*,_std::vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>_>
                                     *)&assertionOrBenchmark), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Detail::AssertionOrBenchmarkResult_*,_std::vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>_>
              ::operator*(&__end1);
    bVar1 = Detail::AssertionOrBenchmarkResult::isAssertion(this_00);
    if (bVar1) {
      stats = Detail::AssertionOrBenchmarkResult::asAssertion(this_00);
      writeAssertion(this,stats);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::AssertionOrBenchmarkResult_*,_std::vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void JunitReporter::writeAssertions( SectionNode const& sectionNode ) {
        for (auto const& assertionOrBenchmark : sectionNode.assertionsAndBenchmarks) {
            if (assertionOrBenchmark.isAssertion()) {
                writeAssertion(assertionOrBenchmark.asAssertion());
            }
        }
    }